

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O2

void __thiscall Indexing::ClauseCodeTree::ClauseMatcher::reset(ClauseMatcher *this)

{
  size_t sVar1;
  long lVar2;
  
  sVar1 = (this->lInfos)._size;
  for (lVar2 = 0; (ulong)(uint)sVar1 * 0x18 - lVar2 != 0; lVar2 = lVar2 + 0x18) {
    CodeTree::LitInfo::dispose((LitInfo *)((long)&((this->lInfos)._array)->liIndex + lVar2));
  }
  Lib::
  Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
  ::reset(&this->lms);
  return;
}

Assistant:

void ClauseCodeTree::ClauseMatcher::reset()
{
  unsigned liCnt=lInfos.size();
  for(unsigned i=0;i<liCnt;i++) {
    lInfos[i].dispose();
  }
  lms.reset();

#if VDEBUG
  ASS_EQ(tree->_clauseMatcherCounter,1);
  tree->_clauseMatcherCounter--;
#endif
}